

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupWindow::apply(QDockWidgetGroupWindow *this)

{
  QList<int> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *in_stack_00000010;
  bool in_stack_0000004f;
  QDockAreaLayoutInfo *in_stack_00000050;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffc8;
  QRect *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  QList<int> *in_stack_fffffffffffffff0;
  QDockAreaLayoutInfo *this_01;
  
  this_01 = *(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
  QWidget::layout((QWidget *)0x5f21fa);
  QDockAreaLayoutInfo::clear(in_stack_ffffffffffffffc8);
  QRect::QRect(in_stack_ffffffffffffffd0);
  *(undefined8 *)(in_RDI + 0x28) = local_18;
  *(QList<int> **)(in_RDI + 0x30) = in_stack_fffffffffffffff0;
  layoutInfo((QDockWidgetGroupWindow *)0x5f2226);
  this_00 = (QList<int> *)(in_RDI + 0x38);
  QDockAreaLayoutInfo::plug(this_01,in_stack_fffffffffffffff0);
  QList<int>::clear(this_00);
  adjustFlags(in_stack_00000010);
  layoutInfo((QDockWidgetGroupWindow *)0x5f225a);
  QDockAreaLayoutInfo::apply(in_stack_00000050,in_stack_0000004f);
  if (*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::apply()
{
    static_cast<QDockWidgetGroupLayout *>(layout())->savedState.clear();
    currentGapRect = QRect();
    layoutInfo()->plug(currentGapPos);
    currentGapPos.clear();
    adjustFlags();
    layoutInfo()->apply(false);
}